

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O0

void Ssw_ReportConeReductions(Ssw_Man_t *p,Aig_Man_t *pAigInit,Aig_Man_t *pAigStop)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Aig_Man_t *p_00;
  Aig_Man_t *p_01;
  Aig_Man_t *pAux;
  Aig_Man_t *pAig2;
  Aig_Man_t *pAig1;
  Aig_Man_t *pAigStop_local;
  Aig_Man_t *pAigInit_local;
  Ssw_Man_t *p_local;
  
  pAVar2 = Aig_ManDupOneOutput(pAigInit,0,1);
  p_00 = Aig_ManScl(pAVar2,1,1,0,-1,-1,0,0);
  Aig_ManStop(pAVar2);
  pAVar2 = Aig_ManDupOneOutput(pAigStop,0,1);
  p_01 = Aig_ManScl(pAVar2,1,1,0,-1,-1,0,0);
  Aig_ManStop(pAVar2);
  iVar1 = Aig_ManNodeNum(p_00);
  p->nNodesBegC = iVar1;
  iVar1 = Aig_ManNodeNum(p_01);
  p->nNodesEndC = iVar1;
  iVar1 = Aig_ManRegNum(p_00);
  p->nRegsBegC = iVar1;
  iVar1 = Aig_ManRegNum(p_01);
  p->nRegsEndC = iVar1;
  Aig_ManStop(p_00);
  Aig_ManStop(p_01);
  return;
}

Assistant:

void Ssw_ReportConeReductions( Ssw_Man_t * p, Aig_Man_t * pAigInit, Aig_Man_t * pAigStop )
{
    Aig_Man_t * pAig1, * pAig2, * pAux;
    pAig1 = Aig_ManDupOneOutput( pAigInit, 0, 1 );
    pAig1 = Aig_ManScl( pAux = pAig1, 1, 1, 0, -1, -1, 0, 0 );
    Aig_ManStop( pAux );
    pAig2 = Aig_ManDupOneOutput( pAigStop, 0, 1 );
    pAig2 = Aig_ManScl( pAux = pAig2, 1, 1, 0, -1, -1, 0, 0 );
    Aig_ManStop( pAux );

    p->nNodesBegC = Aig_ManNodeNum(pAig1);
    p->nNodesEndC = Aig_ManNodeNum(pAig2);
    p->nRegsBegC  = Aig_ManRegNum(pAig1);
    p->nRegsEndC  = Aig_ManRegNum(pAig2);

    Aig_ManStop( pAig1 );
    Aig_ManStop( pAig2 );
}